

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-sdg-dump.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this;
  _Head_base<0UL,_llvm::Module_*,_false> _Var2;
  long lVar3;
  raw_ostream *prVar4;
  int iVar5;
  StringRef SVar6;
  StringRef Str;
  StringRef Str_00;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  LLVMControlDependenceAnalysis CDA;
  SDGDumper dumper;
  DGLLVMPointerAnalysis PTA;
  SystemDependenceGraph sdg;
  LLVMDataDependenceAnalysis DDA;
  SlicerOptions options;
  _Head_base<0UL,_llvm::Module_*,_false> local_778;
  undefined1 local_770 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_710;
  long *local_6d8;
  long *local_6d0;
  SDGDumper local_6c8;
  LLVMControlDependenceAnalysisOptions local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640;
  type local_630;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_628;
  _Alloc_hider local_5f8;
  undefined1 local_5f0;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  local_5e8;
  undefined1 local_5b8;
  undefined1 local_5b0 [40];
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_588;
  size_type local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_550;
  DGLLVMPointerAnalysis local_540;
  SystemDependenceGraph local_4b0;
  LLVMDataDependenceAnalysis local_360;
  undefined1 local_2a0 [208];
  bool local_1d0;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  local_1c8;
  bool local_198;
  _Alloc_hider local_190;
  size_type local_188;
  Offset local_170;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_168;
  CDAlgorithm local_138;
  bool local_134;
  undefined2 local_133;
  _Alloc_hider local_128;
  
  setupStackTraceOnError(argc,argv);
  iVar5 = 1;
  parseSlicerOptions((int)local_2a0,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_770);
  parseModule((char *)&local_778,(LLVMContext *)"llvm-sdg-dump",(SlicerOptions *)local_770);
  if (local_778._M_head_impl != (Module *)0x0) {
    SVar6.Length = (size_t)local_128._M_p;
    SVar6.Data = (char *)local_778._M_head_impl;
    lVar3 = llvm::Module::getFunction(SVar6);
    _Var2._M_head_impl = local_778._M_head_impl;
    if (lVar3 == 0) {
      prVar4 = (raw_ostream *)llvm::errs();
      Str.Length = 0x1e;
      Str.Data = "The entry function not found: ";
      prVar4 = llvm::raw_ostream::operator<<(prVar4,Str);
      prVar4 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar4,(ulong)local_128._M_p);
      Str_00.Length = 1;
      Str_00.Data = "\n";
      llvm::raw_ostream::operator<<(prVar4,Str_00);
    }
    else {
      local_5b0._0_8_ = local_5b0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5b0,local_2a0._0_8_,(pointer)(local_2a0._0_8_ + local_2a0._8_8_));
      local_5b0._32_8_ = local_2a0._32_8_;
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_Rb_tree(&local_588,
                 (_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                  *)(local_2a0 + 0x28));
      local_558 = local_2a0._88_8_;
      aStack_550._M_allocated_capacity = local_2a0._96_8_;
      aStack_550._8_4_ = local_2a0._104_4_;
      aStack_550._M_local_buf[0xc] = local_2a0[0x6c];
      dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
                (&local_540,_Var2._M_head_impl,(LLVMPointerAnalysisOptions *)local_5b0);
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_M_erase(&local_588,(_Link_type)local_588._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
      if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
        operator_delete((void *)local_5b0._0_8_,(ulong)(local_5b0._16_8_ + 1));
      }
      dg::DGLLVMPointerAnalysis::run(&local_540);
      _Var2._M_head_impl = local_778._M_head_impl;
      local_650._M_allocated_capacity = (size_type)&local_640;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_650,local_2a0._112_8_,
                 (pointer)(local_2a0._112_8_ + local_2a0._120_8_));
      local_630 = local_2a0._144_8_;
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_Rb_tree(&local_628,
                 (_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                  *)(local_2a0 + 0x98));
      local_5f0 = local_1d0;
      local_5f8._M_p = (pointer)local_2a0._200_8_;
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
      ::_Rb_tree(&local_5e8,&local_1c8);
      local_5b8 = local_198;
      dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
                (&local_360,_Var2._M_head_impl,&local_540.super_LLVMPointerAnalysis,
                 (LLVMDataDependenceAnalysisOptions *)&local_650);
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
      ::_M_erase(&local_5e8,(_Link_type)local_5e8._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_M_erase(&local_628,(_Link_type)local_628._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._M_allocated_capacity != &local_640) {
        operator_delete((void *)local_650._M_allocated_capacity,local_640._M_allocated_capacity + 1)
        ;
      }
      dg::dda::LLVMDataDependenceAnalysis::run(&local_360);
      _Var2._M_head_impl = local_778._M_head_impl;
      paVar1 = &local_6b0.super_LLVMAnalysisOptions.entryFunction.field_2;
      local_6b0.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6b0,local_190._M_p,local_190._M_p + local_188);
      local_6b0.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset
           = local_170.offset;
      this = &local_6b0.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
              allocationFunctions;
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_Rb_tree(&this->_M_t,&local_168);
      local_6b0.super_ControlDependenceAnalysisOptions.interprocedural = local_134;
      local_6b0.super_ControlDependenceAnalysisOptions.algorithm = local_138;
      local_6b0.super_ControlDependenceAnalysisOptions._61_2_ = local_133;
      dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                ((LLVMControlDependenceAnalysis *)(local_770 + 0x30),_Var2._M_head_impl,&local_6b0,
                 (LLVMPointerAnalysis *)0x0);
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_M_erase(&this->_M_t,
                 (_Link_type)
                 local_6b0.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
                 allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p != paVar1) {
        operator_delete(local_6b0.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                        local_6b0.super_LLVMAnalysisOptions.entryFunction.field_2.
                        _M_allocated_capacity + 1);
      }
      local_770._32_8_ = 0;
      local_770._16_8_ = 4;
      local_770._24_8_ = 0x6e69616d;
      local_770._8_8_ = local_770 + 0x18;
      dg::llvmdg::SystemDependenceGraph::SystemDependenceGraph
                (&local_4b0,local_778._M_head_impl,&local_540.super_LLVMPointerAnalysis,&local_360,
                 (LLVMControlDependenceAnalysis *)(local_770 + 0x30),
                 (SystemDependenceGraphOptions *)(local_770 + 8));
      if ((undefined1 *)local_770._8_8_ != local_770 + 0x18) {
        operator_delete((void *)local_770._8_8_,local_770._24_8_ + 1);
      }
      local_6c8.options = (SlicerOptions *)local_2a0;
      local_6c8.bb_only = (bool)dump_bb_only[0x80];
      local_6c8.dg = &local_4b0;
      SDGDumper::dumpToDot(&local_6c8,(char *)0x0);
      std::
      _Rb_tree<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>,_std::_Select1st<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>_>
      ::_M_erase(&local_4b0._blk_mapping._M_t,
                 (_Link_type)
                 local_4b0._blk_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      std::
      _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::sdg::DependenceGraph_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::sdg::DependenceGraph_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::sdg::DependenceGraph_*>_>_>
      ::_M_erase(&local_4b0._fun_mapping._M_t,
                 (_Link_type)
                 local_4b0._fun_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      std::
      _Rb_tree<const_dg::sdg::DGElement_*,_std::pair<const_dg::sdg::DGElement_*const,_llvm::Value_*>,_std::_Select1st<std::pair<const_dg::sdg::DGElement_*const,_llvm::Value_*>_>,_std::less<const_dg::sdg::DGElement_*>,_std::allocator<std::pair<const_dg::sdg::DGElement_*const,_llvm::Value_*>_>_>
      ::_M_erase(&local_4b0._rev_mapping._M_t,
                 (_Link_type)
                 local_4b0._rev_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      std::
      _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::sdg::DGElement_*>,_std::_Select1st<std::pair<const_llvm::Value_*const,_dg::sdg::DGElement_*>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::sdg::DGElement_*>_>_>
      ::_M_erase(&local_4b0._mapping._M_t,
                 (_Link_type)
                 local_4b0._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      std::
      vector<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>,_std::allocator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_>_>
      ::~vector(&local_4b0._sdg._graphs);
      std::
      _Rb_tree<dg::sdg::DGNode_*,_dg::sdg::DGNode_*,_std::_Identity<dg::sdg::DGNode_*>,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
      ::_M_erase((_Rb_tree<dg::sdg::DGNode_*,_dg::sdg::DGNode_*,_std::_Identity<dg::sdg::DGNode_*>,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
                  *)&local_4b0._sdg,
                 (_Link_type)
                 local_4b0._sdg._globals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._options.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p !=
          &local_4b0._options.super_LLVMAnalysisOptions.entryFunction.field_2) {
        operator_delete(local_4b0._options.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                        local_4b0._options.super_LLVMAnalysisOptions.entryFunction.field_2.
                        _M_allocated_capacity + 1);
      }
      if (local_6d0 != (long *)0x0) {
        (**(code **)(*local_6d0 + 8))();
      }
      local_6d0 = (long *)0x0;
      if (local_6d8 != (long *)0x0) {
        (**(code **)(*local_6d8 + 8))();
      }
      local_6d8 = (long *)0x0;
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_M_erase(&local_710,(_Link_type)local_710._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
      if (local_738 != &local_728) {
        operator_delete(local_738,(ulong)(local_728._M_allocated_capacity + 1));
      }
      dg::dda::LLVMDataDependenceAnalysis::~LLVMDataDependenceAnalysis(&local_360);
      local_540.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis =
           (_func_int **)&PTR_hasPointsTo_0011d7c0;
      std::
      unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
      ::~unique_ptr(&local_540._builder);
      if ((__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
          )local_540.PTA._M_t.
           super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
           .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
          )0x0) {
        (**(code **)(*(long *)local_540.PTA._M_t.
                              super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                              .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl
                    + 8))();
      }
      local_540.PTA._M_t.
      super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
      ._M_t.
      super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
      .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl =
           (__uniq_ptr_data<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>,_true,_true>
            )(__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
              )0x0;
      dg::LLVMPointerAnalysis::~LLVMPointerAnalysis(&local_540.super_LLVMPointerAnalysis);
      iVar5 = 0;
    }
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)&local_778);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_770);
  SlicerOptions::~SlicerOptions((SlicerOptions *)local_2a0);
  return iVar5;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-sdg-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    DGLLVMPointerAnalysis PTA(M.get(), options.dgOptions.PTAOptions);
    PTA.run();
    LLVMDataDependenceAnalysis DDA(M.get(), &PTA, options.dgOptions.DDAOptions);
    DDA.run();
    LLVMControlDependenceAnalysis CDA(M.get(), options.dgOptions.CDAOptions);
    // CDA runs on-demand

    llvmdg::SystemDependenceGraph sdg(M.get(), &PTA, &DDA, &CDA);

    SDGDumper dumper(options, &sdg, dump_bb_only);
    dumper.dumpToDot();

    return 0;
}